

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

ResolvedTrace * __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::resolve
          (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this,
          ResolvedTrace *trace)

{
  ref_t ppcVar1;
  ResolvedTrace *in_RDX;
  long in_RSI;
  ResolvedTrace *in_RDI;
  char *funcname_end;
  char *funcname;
  char *filename;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 uVar2;
  ResolvedTrace *this_00;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *local_30;
  char *local_28;
  
  this_00 = in_RDI;
  ppcVar1 = details::handle<char_**,_backward::details::deleter<void,_void_*,_&free>_>::operator[]
                      ((handle<char_**,_backward::details::deleter<void,_void_*,_&free>_> *)
                       (in_RSI + 0x60),(in_RDX->super_Trace).idx);
  local_28 = *ppcVar1;
  while( true ) {
    uVar2 = false;
    if (*local_28 != '\0') {
      uVar2 = *local_28 != '(';
    }
    if ((bool)uVar2 == false) break;
    local_28 = local_28 + 1;
  }
  std::__cxx11::string::assign<char*,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (*local_28 != '\0') {
    do {
      local_30 = local_28 + 1;
      in_stack_ffffffffffffff8e = false;
      if ((*local_30 != '\0') && (in_stack_ffffffffffffff8e = false, *local_30 != ')')) {
        in_stack_ffffffffffffff8e = *local_30 != '+';
      }
      local_28 = local_30;
    } while ((bool)in_stack_ffffffffffffff8e != false);
    *local_30 = '\0';
    TraceResolverImplBase::demangle_abi_cxx11_((TraceResolverImplBase *)this_00,(char *)in_RDX);
    std::__cxx11::string::operator=
              ((string *)&in_RDX->object_function,(string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::operator=((string *)&in_RDX->source,(string *)&in_RDX->object_function);
  }
  ResolvedTrace::ResolvedTrace
            (in_RDX,(ResolvedTrace *)
                    CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  return in_RDI;
}

Assistant:

ResolvedTrace resolve(ResolvedTrace trace) override {
    char *filename = _symbols[trace.idx];
    char *funcname = filename;
    while (*funcname && *funcname != '(') {
      funcname += 1;
    }
    trace.object_filename.assign(filename,
                                 funcname); // ok even if funcname is the ending
                                            // \0 (then we assign entire string)

    if (*funcname) { // if it's not end of string (e.g. from last frame ip==0)
      funcname += 1;
      char *funcname_end = funcname;
      while (*funcname_end && *funcname_end != ')' && *funcname_end != '+') {
        funcname_end += 1;
      }
      *funcname_end = '\0';
      trace.object_function = this->demangle(funcname);
      trace.source.function = trace.object_function; // we cannot do better.
    }
    return trace;
  }